

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElfFile.cpp
# Opt level: O1

int __thiscall ElfFile::findSegmentlessSection(ElfFile *this,string *name)

{
  pointer ppEVar1;
  char *__s1;
  size_type sVar2;
  ElfSection *pEVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  
  uVar6 = (uint)((ulong)((long)(this->sections).
                               super__Vector_base<ElfSection_*,_std::allocator<ElfSection_*>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->sections).
                              super__Vector_base<ElfSection_*,_std::allocator<ElfSection_*>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 3);
  if (0 < (int)uVar6) {
    ppEVar1 = (this->segmentlessSections).
              super__Vector_base<ElfSection_*,_std::allocator<ElfSection_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    __s1 = (name->_M_dataplus)._M_p;
    sVar2 = name->_M_string_length;
    uVar5 = 0;
    do {
      pEVar3 = ppEVar1[uVar5];
      if ((sVar2 == (pEVar3->name)._M_string_length) &&
         (iVar4 = strcasecmp(__s1,(pEVar3->name)._M_dataplus._M_p), iVar4 == 0)) {
        return (int)uVar5;
      }
      uVar5 = uVar5 + 1;
    } while ((uVar6 & 0x7fffffff) != uVar5);
  }
  return -1;
}

Assistant:

int ElfFile::findSegmentlessSection(const std::string& name)
{
	for (int i = 0; i < (int)sections.size(); i++)
	{
		if (stringEqualInsensitive(name,segmentlessSections[i]->getName()))
			return i;
	}

	return -1;
}